

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void externalSubsetDebug(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.externalSubset(%s,",name);
  if (ExternalID == (xmlChar *)0x0) {
    fwrite(" ,",2,1,(FILE *)SAXdebug);
  }
  else {
    fprintf((FILE *)SAXdebug," %s,",ExternalID);
  }
  if (SystemID != (xmlChar *)0x0) {
    fprintf((FILE *)SAXdebug," %s)\n",SystemID);
    return;
  }
  fwrite(" )\n",3,1,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
externalSubsetDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.externalSubset(%s,", name);
    if (ExternalID == NULL)
	fprintf(SAXdebug, " ,");
    else
	fprintf(SAXdebug, " %s,", ExternalID);
    if (SystemID == NULL)
	fprintf(SAXdebug, " )\n");
    else
	fprintf(SAXdebug, " %s)\n", SystemID);
}